

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predictor_enc.c
# Opt level: O1

int64_t GetPredictionCostCrossColorBlue
                  (uint32_t *argb,int stride,int tile_width,int tile_height,VP8LMultipliers prev_x,
                  VP8LMultipliers prev_y,int green_to_blue,int red_to_blue,
                  uint32_t *accumulated_blue_histo)

{
  uint64_t uVar1;
  int64_t iVar2;
  long lVar3;
  uint32_t histo [256];
  uint32_t local_438 [258];
  
  memset(local_438,0,0x400);
  (*VP8LCollectColorBlueTransforms)
            (argb,stride,tile_width,tile_height,green_to_blue,red_to_blue,local_438);
  uVar1 = (*VP8LCombinedShannonEntropy)(local_438,accumulated_blue_histo);
  iVar2 = PredictionCostBias(local_438,3,0xf0);
  lVar3 = iVar2 + uVar1;
  if ((green_to_blue & 0xffU) == (prev_x._1_2_ & 0xff)) {
    lVar3 = iVar2 + uVar1 + -0x1800000;
  }
  if ((green_to_blue & 0xffU) == (prev_y._1_2_ & 0xff)) {
    lVar3 = lVar3 + -0x1800000;
  }
  if ((red_to_blue & 0xffU) == (uint)((uint3)prev_x >> 0x10)) {
    lVar3 = lVar3 + -0x1800000;
  }
  if ((red_to_blue & 0xffU) == (uint)((uint3)prev_y >> 0x10)) {
    lVar3 = lVar3 + -0x1800000;
  }
  if (green_to_blue == 0) {
    lVar3 = lVar3 + -0x1800000;
  }
  if (red_to_blue == 0) {
    lVar3 = lVar3 + -0x1800000;
  }
  return lVar3;
}

Assistant:

static int64_t GetPredictionCostCrossColorBlue(
    const uint32_t* argb, int stride, int tile_width, int tile_height,
    VP8LMultipliers prev_x, VP8LMultipliers prev_y, int green_to_blue,
    int red_to_blue, const uint32_t accumulated_blue_histo[256]) {
  uint32_t histo[256] = { 0 };
  int64_t cur_diff;

  VP8LCollectColorBlueTransforms(argb, stride, tile_width, tile_height,
                                 green_to_blue, red_to_blue, histo);

  cur_diff = PredictionCostCrossColor(accumulated_blue_histo, histo);
  if ((uint8_t)green_to_blue == prev_x.green_to_blue_) {
    // favor keeping the areas locally similar
    cur_diff -= 3ll << LOG_2_PRECISION_BITS;
  }
  if ((uint8_t)green_to_blue == prev_y.green_to_blue_) {
    // favor keeping the areas locally similar
    cur_diff -= 3ll << LOG_2_PRECISION_BITS;
  }
  if ((uint8_t)red_to_blue == prev_x.red_to_blue_) {
    // favor keeping the areas locally similar
    cur_diff -= 3ll << LOG_2_PRECISION_BITS;
  }
  if ((uint8_t)red_to_blue == prev_y.red_to_blue_) {
    // favor keeping the areas locally similar
    cur_diff -= 3ll << LOG_2_PRECISION_BITS;
  }
  if (green_to_blue == 0) {
    cur_diff -= 3ll << LOG_2_PRECISION_BITS;
  }
  if (red_to_blue == 0) {
    cur_diff -= 3ll << LOG_2_PRECISION_BITS;
  }
  return cur_diff;
}